

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O0

void __thiscall sign_verify::test_method(sign_verify *this)

{
  bool bVar1;
  int iVar2;
  value_expr<bool> *this_00;
  size_type sVar3;
  uchar *puVar4;
  pointer pvVar5;
  lazy_ostream *this_01;
  size_t siglen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  picnic_l1_fs_publickey_t public_key;
  picnic_l1_fs_privatekey_t private_key;
  array<unsigned_char,_32UL> m;
  size_t max_signature_size;
  array<unsigned_char,_32UL> *in_stack_00000e30;
  basic_cstring<const_char> *in_stack_fffffffffffffa70;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  size_type in_stack_fffffffffffffa88;
  array<unsigned_char,_32UL> *this_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa90;
  const_string *in_stack_fffffffffffffaa8;
  const_string *msg;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  lazy_ostream *in_stack_fffffffffffffab8;
  unit_test_log_t *in_stack_fffffffffffffac0;
  const_string *this_03;
  undefined8 in_stack_fffffffffffffaf0;
  array<unsigned_char,_32UL> *this_04;
  value_expr<const_unsigned_long_&> *in_stack_fffffffffffffaf8;
  basic_cstring<const_char> local_468;
  basic_cstring<const_char> local_458;
  lazy_ostream local_448;
  basic_cstring<const_char> local_3f8;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  lazy_ostream local_3c8 [4];
  undefined1 in_stack_fffffffffffffc87;
  shared_count in_stack_fffffffffffffc88;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  lazy_ostream local_330 [2];
  undefined4 local_310;
  assertion_result local_2f0;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  lazy_ostream local_298 [2];
  undefined1 local_273;
  assertion_result local_270;
  basic_cstring<const_char> local_248;
  undefined8 local_238 [4];
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  lazy_ostream local_1f8 [2];
  undefined1 local_1d3;
  assertion_result local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  lazy_ostream local_178 [2];
  undefined1 local_153;
  assertion_result local_150;
  basic_cstring<const_char> local_128;
  undefined1 local_118 [32];
  undefined1 local_f8 [48];
  array<unsigned_char,_32UL> local_c8;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98 [2];
  lazy_ostream local_78 [3];
  assertion_result local_48;
  basic_cstring<const_char> local_20;
  undefined8 local_10;
  
  local_10 = picnic_l1_fs_signature_size();
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac0,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (unsigned_long *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              (in_stack_fffffffffffffaf8,SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_98,"max_signature_size",0x12);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_48,local_78,&local_a8,0x1e,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13d17c);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13d189);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(in_stack_00000e30);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac0,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
    iVar2 = picnic_l1_fs_keygen(local_118,local_f8);
    local_153 = iVar2 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (bool *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)in_stack_fffffffffffffaf8,
               SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,"!picnic_l1_fs_keygen(&public_key, &private_key)",0x2f);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_150,local_178,&local_198,0x26,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13d312);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13d31f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac0,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
    iVar2 = picnic_l1_fs_validate_keypair(local_f8,local_118);
    local_1d3 = iVar2 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (bool *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)in_stack_fffffffffffffaf8,
               SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,"!picnic_l1_fs_validate_keypair(&private_key, &public_key)",0x39);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,local_1f8,&local_218,0x29,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13d49d);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13d4aa);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13d4cc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_238[0] = local_10;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac0,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
    this_04 = &local_c8;
    this_00 = (value_expr<bool> *)
              std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x13d565);
    sVar3 = std::array<unsigned_char,_32UL>::size(this_04);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13d58f);
    iVar2 = picnic_l1_fs_sign(local_f8,this_00,sVar3,puVar4,local_238);
    local_273 = iVar2 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (bool *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (this_00,SUB81((ulong)this_04 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "!picnic_l1_fs_sign(&private_key, m.data(), m.size(), sig.data(), &siglen)",0x49);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_270,local_298,&local_2b8,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13d6b6);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13d6c3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac0,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (unsigned_long *)in_stack_fffffffffffffa70);
    local_310 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator>((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
               *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
              (int *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
                *)in_stack_fffffffffffffc88.pi_,(bool)in_stack_fffffffffffffc87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,"siglen > 0",10);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_2f0,local_330,&local_350,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13d83e);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13d84b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_03 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_03,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (unsigned_long *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator<=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (unsigned_long *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)in_stack_fffffffffffffc88.pi_,(bool)in_stack_fffffffffffffc87);
    in_stack_fffffffffffffab8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,"siglen <= max_signature_size",0x1c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffc78,local_3c8,&local_3e8,0x32,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13d9bb);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13d9c8);
    in_stack_fffffffffffffab7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffab7);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffa70);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_03,(const_string *)in_stack_fffffffffffffab8,
               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),msg);
    this_02 = &local_c8;
    pvVar5 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x13da4c);
    sVar3 = std::array<unsigned_char,_32UL>::size(this_02);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13da6d);
    picnic_l1_fs_verify(local_118,pvVar5,sVar3,puVar4,local_238[0]);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               (bool *)in_stack_fffffffffffffa70);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (this_00,SUB81((ulong)this_04 >> 0x38,0));
    this_01 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_458,
               "!picnic_l1_fs_verify(&public_key, m.data(), m.size(), sig.data(), siglen)",0x49);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
               in_stack_fffffffffffffa70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_468,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffbe0,&local_448,&local_468,0x34,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13db82);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13db8f);
    in_stack_fffffffffffffa7f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa7f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
}